

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3MultiValuesEnd(Parse *pParse,Select *pVal)

{
  SrcList *pSVar1;
  
  if (((pVal != (Select *)0x0) && (pSVar1 = pVal->pSrc, 0 < pSVar1->nSrc)) &&
     ((pSVar1->a[0].fg.field_0x1 & 4) != 0)) {
    sqlite3VdbeEndCoroutine(pParse->pVdbe,(pSVar1->a[0].u4.pSubq)->regReturn);
    sqlite3VdbeJumpHere(pParse->pVdbe,((pSVar1->a[0].u4.pSchema)->tblHash).htsize - 1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MultiValuesEnd(Parse *pParse, Select *pVal){
  if( ALWAYS(pVal) && pVal->pSrc->nSrc>0 ){
    SrcItem *pItem = &pVal->pSrc->a[0];
    assert( (pItem->fg.isSubquery && pItem->u4.pSubq!=0) || pParse->nErr );
    if( pItem->fg.isSubquery ){
      sqlite3VdbeEndCoroutine(pParse->pVdbe, pItem->u4.pSubq->regReturn);
      sqlite3VdbeJumpHere(pParse->pVdbe, pItem->u4.pSubq->addrFillSub - 1);
    }
  }
}